

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O2

void __thiscall undo::UndoHistory::moveTo(UndoHistory *this,UndoState *new_state)

{
  UndoState *pUVar1;
  _Elt_pointer ppUVar2;
  UndoState *a;
  stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
  redo_parents;
  UndoState *local_80;
  _Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_> local_78;
  
  a = this->m_cur;
  pUVar1 = findCommonParent(this,a,new_state);
  if (a != (UndoState *)0x0) {
    while (a != pUVar1) {
      (*a->m_cmd->_vptr_UndoCommand[2])();
      a = this->m_cur->m_parent;
      this->m_cur = a;
    }
  }
  if (new_state != (UndoState *)0x0) {
    std::
    stack<undo::UndoState_const*,std::deque<undo::UndoState_const*,std::allocator<undo::UndoState_const*>>>
    ::stack<std::deque<undo::UndoState_const*,std::allocator<undo::UndoState_const*>>,void>
              ((stack<const_undo::UndoState_*,_std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>_>
                *)&local_78);
    for (local_80 = new_state; local_80 != pUVar1; local_80 = local_80->m_parent) {
      std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>::push_back
                ((deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_> *)
                 &local_78,&local_80);
    }
    while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppUVar2 = local_78._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppUVar2 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_80 = ppUVar2[-1];
      std::deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>::pop_back
                ((deque<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_> *)
                 &local_78);
      (*local_80->m_cmd->_vptr_UndoCommand[3])();
    }
    std::_Deque_base<const_undo::UndoState_*,_std::allocator<const_undo::UndoState_*>_>::
    ~_Deque_base(&local_78);
  }
  this->m_cur = new_state;
  return;
}

Assistant:

void UndoHistory::moveTo(const UndoState* new_state)
{
  const UndoState* common = findCommonParent(m_cur, new_state);

  if (m_cur) {
    while (m_cur != common) {
      m_cur->m_cmd->undo();
      m_cur = m_cur->m_parent;
    }
  }

  if (new_state) {
    std::stack<const UndoState*> redo_parents;
    const UndoState* p = new_state;
    while (p != common) {
      redo_parents.push(p);
      p = p->m_parent;
    }

    while (!redo_parents.empty()) {
      p = redo_parents.top();
      redo_parents.pop();

      p->m_cmd->redo();
    }
  }

  m_cur = const_cast<UndoState*>(new_state);
}